

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall Plan::CleanNode(Plan *this,DependencyScan *scan,Node *node,string *err)

{
  _Rb_tree_header *p_Var1;
  Edge *pEVar2;
  bool bVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> _Var6;
  _Base_ptr p_Var7;
  Node *most_recent_input;
  Node **ppNVar8;
  long lVar9;
  iterator i;
  Node **ppNVar10;
  pointer ppNVar11;
  pointer ppEVar12;
  bool bVar13;
  bool outputs_dirty;
  bool local_51;
  Node *local_50;
  Plan *local_48;
  DependencyScan *local_40;
  string *local_38;
  
  node->dirty_ = false;
  ppEVar12 = (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  bVar13 = ppEVar12 ==
           (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (!bVar13) {
    p_Var1 = &(this->want_)._M_t._M_impl.super__Rb_tree_header;
    local_50 = node;
    local_48 = this;
    local_40 = scan;
    local_38 = err;
    do {
      p_Var7 = (this->want_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var1->_M_header;
      if (p_Var7 != (_Base_ptr)0x0) {
        do {
          if (*(Edge **)(p_Var7 + 1) >= *ppEVar12) {
            p_Var5 = p_Var7;
          }
          p_Var7 = (&p_Var7->_M_left)[*(Edge **)(p_Var7 + 1) < *ppEVar12];
        } while (p_Var7 != (_Base_ptr)0x0);
      }
      p_Var7 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (p_Var7 = p_Var5, *ppEVar12 < *(Edge **)(p_Var5 + 1))) {
        p_Var7 = &p_Var1->_M_header;
      }
      lVar9 = 0;
      if ((((_Rb_tree_header *)p_Var7 != p_Var1) && (*(int *)&p_Var7[1]._M_parent != 0)) &&
         (pEVar2 = *ppEVar12, pEVar2->deps_missing_ == false)) {
        ppNVar10 = (pEVar2->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppNVar8 = (pEVar2->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish + -(long)pEVar2->order_only_deps_;
        lVar9 = 0;
        _Var6 = std::
                __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_pred<std::_Mem_fn<bool(Node::*)()const>>>
                          (ppNVar10,ppNVar8,Node::dirty,0);
        this = local_48;
        node = local_50;
        if (_Var6._M_current == ppNVar8) {
          most_recent_input = (Node *)0x0;
          for (; ppNVar10 != ppNVar8; ppNVar10 = ppNVar10 + 1) {
            if ((most_recent_input == (Node *)0x0) ||
               (most_recent_input->mtime_ < (*ppNVar10)->mtime_)) {
              most_recent_input = *ppNVar10;
            }
          }
          local_51 = false;
          bVar3 = DependencyScan::RecomputeOutputsDirty
                            (local_40,*ppEVar12,most_recent_input,&local_51,local_38);
          lVar9 = 1;
          this = local_48;
          node = local_50;
          if (bVar3) {
            if (local_51 == false) {
              ppNVar11 = ((*ppEVar12)->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              lVar9 = 8;
              bVar3 = ppNVar11 ==
                      ((*ppEVar12)->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
              if (!bVar3) {
                bVar4 = CleanNode(local_48,local_40,*ppNVar11,local_38);
                if (bVar4) {
                  do {
                    ppNVar11 = ppNVar11 + 1;
                    bVar3 = ppNVar11 ==
                            ((*ppEVar12)->outputs_).
                            super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                    if (bVar3) goto LAB_0010e5e2;
                    bVar4 = CleanNode(local_48,local_40,*ppNVar11,local_38);
                  } while (bVar4);
                  lVar9 = 1;
                }
                else {
                  lVar9 = 1;
                }
              }
LAB_0010e5e2:
              this = local_48;
              node = local_50;
              if (bVar3) {
                *(undefined4 *)&p_Var7[1]._M_parent = 0;
                local_48->wanted_edges_ = local_48->wanted_edges_ + -1;
                bVar3 = Edge::is_phony(*ppEVar12);
                if (!bVar3) {
                  this->command_edges_ = this->command_edges_ + -1;
                }
                lVar9 = 0;
                node = local_50;
              }
            }
            else {
              lVar9 = 0;
            }
          }
        }
      }
      if (lVar9 != 0) {
        return bVar13;
      }
      ppEVar12 = ppEVar12 + 1;
      bVar13 = ppEVar12 ==
               (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (!bVar13);
  }
  return bVar13;
}

Assistant:

bool Plan::CleanNode(DependencyScan* scan, Node* node, string* err) {
  node->set_dirty(false);

  for (vector<Edge*>::const_iterator oe = node->out_edges().begin();
       oe != node->out_edges().end(); ++oe) {
    // Don't process edges that we don't actually want.
    map<Edge*, Want>::iterator want_e = want_.find(*oe);
    if (want_e == want_.end() || want_e->second == kWantNothing)
      continue;

    // Don't attempt to clean an edge if it failed to load deps.
    if ((*oe)->deps_missing_)
      continue;

    // If all non-order-only inputs for this edge are now clean,
    // we might have changed the dirty state of the outputs.
    vector<Node*>::iterator
        begin = (*oe)->inputs_.begin(),
        end = (*oe)->inputs_.end() - (*oe)->order_only_deps_;
#if __cplusplus < 201703L
#define MEM_FN mem_fun
#else
#define MEM_FN mem_fn  // mem_fun was removed in C++17.
#endif
    if (find_if(begin, end, MEM_FN(&Node::dirty)) == end) {
      // Recompute most_recent_input.
      Node* most_recent_input = NULL;
      for (vector<Node*>::iterator i = begin; i != end; ++i) {
        if (!most_recent_input || (*i)->mtime() > most_recent_input->mtime())
          most_recent_input = *i;
      }

      // Now, this edge is dirty if any of the outputs are dirty.
      // If the edge isn't dirty, clean the outputs and mark the edge as not
      // wanted.
      bool outputs_dirty = false;
      if (!scan->RecomputeOutputsDirty(*oe, most_recent_input,
                                       &outputs_dirty, err)) {
        return false;
      }
      if (!outputs_dirty) {
        for (vector<Node*>::iterator o = (*oe)->outputs_.begin();
             o != (*oe)->outputs_.end(); ++o) {
          if (!CleanNode(scan, *o, err))
            return false;
        }

        want_e->second = kWantNothing;
        --wanted_edges_;
        if (!(*oe)->is_phony())
          --command_edges_;
      }
    }
  }
  return true;
}